

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddConfigVariableFlags
          (cmLocalGenerator *this,string *flags,string *var,string *config)

{
  char *pcVar1;
  ulong uVar2;
  string local_78;
  undefined1 local_48 [8];
  string flagsVar;
  string *config_local;
  string *var_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  flagsVar.field_2._8_8_ = config;
  std::__cxx11::string::string((string *)local_48,(string *)var);
  pcVar1 = cmMakefile::GetDefinition(this->Makefile,(string *)local_48);
  (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar1);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)local_48,"_");
    cmsys::SystemTools::UpperCase(&local_78,(string *)flagsVar.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_48,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    pcVar1 = cmMakefile::GetDefinition(this->Makefile,(string *)local_48);
    (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar1);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmLocalGenerator::AddConfigVariableFlags(std::string& flags,
                                              const std::string& var,
                                              const std::string& config)
{
  // Add the flags from the variable itself.
  std::string flagsVar = var;
  this->AppendFlags(flags, this->Makefile->GetDefinition(flagsVar));
  // Add the flags from the build-type specific variable.
  if (!config.empty()) {
    flagsVar += "_";
    flagsVar += cmSystemTools::UpperCase(config);
    this->AppendFlags(flags, this->Makefile->GetDefinition(flagsVar));
  }
}